

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestArrObj::Serialize(TestArrObj *this,CJSON *json)

{
  allocator<char> local_39;
  string local_38;
  CJSON *local_18;
  CJSON *json_local;
  TestArrObj *this_local;
  
  local_18 = json;
  json_local = (CJSON *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"str",&local_39);
  CJSON::AddPair<std::__cxx11::string>(json,&local_38,&this->str);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void Serialize(CJSON &json) const 
    {
        json.AddPair("str", str);
    }